

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

uint __thiscall bsim::quad_value_bit_vector::to_type<unsigned_int>(quad_value_bit_vector *this)

{
  byte bVar1;
  int iVar2;
  quad_value_bit_vector *in_RDI;
  int i;
  uint exp;
  uint tmp;
  int iVar3;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  local_10 = 1;
  local_14 = 0;
  while( true ) {
    iVar3 = local_14;
    iVar2 = bitLength(in_RDI);
    if (iVar2 <= iVar3) break;
    iVar2 = local_10;
    get((quad_value_bit_vector *)CONCAT44(iVar3,local_10),0);
    bVar1 = quad_value::binary_value((quad_value *)in_RDI);
    local_c = iVar2 * (uint)bVar1 + local_c;
    local_10 = local_10 << 1;
    local_14 = local_14 + 1;
  }
  return local_c;
}

Assistant:

ConvType to_type() const {
      ConvType tmp = 0;
      ConvType exp = 1;
      for (int i = 0; i < bitLength(); i++) {
        tmp += exp*get(i).binary_value();
        exp *= 2;
      }
      return tmp;
      // ConvType tmp = *(const_cast<ConvType*>((const ConvType*) (&(bits[0]))));
      // //TODO FIXME I am a sketchy hack.
      // ConvType mask = sizeof(ConvType) > bits.size() ? (1<<N)-1 : -1; 
      // return tmp & mask;
    }